

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool __thiscall
cmForEachCommand::InitialPass
          (cmForEachCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  value_type *__x;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  cmForEachFunctionBlocker *this_00;
  long lVar7;
  ostream *poVar8;
  uint uVar9;
  long lStack_200;
  allocator local_1f5;
  uint local_1f4;
  cmForEachFunctionBlocker *local_1f0;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  range;
  char buffer [100];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    std::__cxx11::string::string
              ((string *)buffer,"called with incorrect number of arguments",(allocator *)&local_1e8)
    ;
    cmCommand::SetError(&this->super_cmCommand,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
LAB_003deff6:
    bVar3 = false;
  }
  else {
    if (((ulong)((long)pbVar2 - (long)pbVar1) < 0x21) ||
       (bVar3 = std::operator==(pbVar1 + 1,"IN"), !bVar3)) {
      this_00 = (cmForEachFunctionBlocker *)operator_new(0x90);
      cmForEachFunctionBlocker::cmForEachFunctionBlocker(this_00,(this->super_cmCommand).Makefile);
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) ||
         (bVar3 = std::operator==(pbVar1 + 1,"RANGE"), !bVar3)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_00->Args,args);
      }
      else {
        __x = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)__x >> 5;
        uVar4 = 0;
        if (lVar7 == 3) {
          lStack_200 = 0x40;
          uVar4 = 0;
LAB_003df03a:
          iVar5 = atoi(*(char **)((long)&(__x->_M_dataplus)._M_p + lStack_200));
LAB_003df048:
          bVar3 = iVar5 < (int)uVar4;
          uVar9 = -(uint)bVar3 | 1;
        }
        else {
          if (lVar7 == 4) {
            uVar4 = atoi(__x[2]._M_dataplus._M_p);
            lStack_200 = 0x60;
            goto LAB_003df03a;
          }
          iVar5 = 0;
          if (lVar7 != 5) goto LAB_003df048;
          uVar4 = atoi(__x[2]._M_dataplus._M_p);
          iVar5 = atoi(__x[3]._M_dataplus._M_p);
          uVar6 = atoi(__x[4]._M_dataplus._M_p);
          bVar3 = iVar5 < (int)uVar4;
          uVar9 = -(uint)bVar3 | 1;
          if (uVar6 != 0) {
            uVar9 = uVar6;
          }
        }
        if (((bVar3) && (0 < (int)uVar9)) || (((int)uVar4 < iVar5 && ((int)uVar9 < 0)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)buffer);
          std::operator<<((ostream *)buffer,"called with incorrect range specification: start ");
          poVar8 = (ostream *)std::ostream::operator<<(buffer,uVar4);
          poVar8 = std::operator<<(poVar8,", stop ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
          poVar8 = std::operator<<(poVar8,", step ");
          std::ostream::operator<<(poVar8,uVar9);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)buffer);
          goto LAB_003deff6;
        }
        range.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        range.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        range.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f0 = this_00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&range,__x);
        local_1f4 = uVar9 + iVar5;
        do {
          if ((0 < (int)uVar9 && iVar5 < (int)uVar4) || ((int)uVar9 < 0 && (int)uVar4 < iVar5))
          break;
          sprintf(buffer,"%d",(ulong)uVar4);
          std::__cxx11::string::string((string *)&local_1e8,buffer,&local_1f5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&range,
                     &local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          uVar4 = uVar4 + uVar9;
        } while (local_1f4 != uVar4);
        this_00 = local_1f0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_1f0->Args,&range);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&range);
      }
      cmMakefile::AddFunctionBlocker
                ((this->super_cmCommand).Makefile,&this_00->super_cmFunctionBlocker);
    }
    else {
      HandleInMode(this,args);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool cmForEachCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  if (args.size() > 1 && args[1] == "IN") {
    return this->HandleInMode(args);
  }

  // create a function blocker
  cmForEachFunctionBlocker* f = new cmForEachFunctionBlocker(this->Makefile);
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        stop = atoi(args[2].c_str());
      }
      if (args.size() == 4) {
        start = atoi(args[2].c_str());
        stop = atoi(args[3].c_str());
      }
      if (args.size() == 5) {
        start = atoi(args[2].c_str());
        stop = atoi(args[3].c_str());
        step = atoi(args[4].c_str());
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        std::ostringstream str;
        str << "called with incorrect range specification: start ";
        str << start << ", stop " << stop << ", step " << step;
        this->SetError(str.str());
        return false;
      }
      std::vector<std::string> range;
      char buffer[100];
      range.push_back(args[0]);
      int cc;
      for (cc = start;; cc += step) {
        if ((step > 0 && cc > stop) || (step < 0 && cc < stop)) {
          break;
        }
        sprintf(buffer, "%d", cc);
        range.push_back(buffer);
        if (cc == stop) {
          break;
        }
      }
      f->Args = range;
    } else {
      f->Args = args;
    }
  } else {
    f->Args = args;
  }
  this->Makefile->AddFunctionBlocker(f);

  return true;
}